

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::color4f>
          (Attribute *this,double t,color4f *dst,TimeSampleInterpolationType tinterp)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::color4f> local_60;
  undefined1 local_4c [8];
  optional<tinyusdz::value::color4f> v;
  TimeSampleInterpolationType tinterp_local;
  color4f *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (color4f *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 8),t);
    bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 8));
    if ((bVar2) && (bVar2 = has_value(this), bVar2)) {
      primvar::PrimVar::get_value<tinyusdz::value::color4f>(&local_60,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::color4f>::
      optional<tinyusdz::value::color4f,_0>
                ((optional<tinyusdz::value::color4f> *)local_4c,&local_60);
      nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional(&local_60);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4c);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::color4f>::value
                           ((optional<tinyusdz::value::color4f> *)local_4c);
        fVar1 = pvVar3->g;
        dst->r = pvVar3->r;
        dst->g = fVar1;
        fVar1 = pvVar3->a;
        dst->b = pvVar3->b;
        dst->a = fVar1;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional
                ((optional<tinyusdz::value::color4f> *)local_4c);
      if (bVar2) goto LAB_007c6b30;
    }
    bVar2 = has_timesamples(this);
    if (bVar2) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::color4f>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::color4f>(this,dst);
    }
  }
LAB_007c6b30:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }